

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O1

void FAudio_INTERNAL_FreeEffectChain(FAudioVoice *voice)

{
  long lVar1;
  ulong uVar2;
  
  if ((voice->effects).count != 0) {
    if ((voice->effects).count != 0) {
      lVar1 = 0;
      uVar2 = 0;
      do {
        (**(code **)(*(long *)((long)&((voice->effects).desc)->pEffect + lVar1) + 0x40))();
        (**(code **)(*(long *)((long)&((voice->effects).desc)->pEffect + lVar1) + 8))();
        uVar2 = uVar2 + 1;
        lVar1 = lVar1 + 0x10;
      } while (uVar2 < (voice->effects).count);
    }
    (*voice->audio->pFree)((voice->effects).desc);
    (*voice->audio->pFree)((voice->effects).parameters);
    (*voice->audio->pFree)((voice->effects).parameterSizes);
    (*voice->audio->pFree)((voice->effects).parameterUpdates);
    (*voice->audio->pFree)((voice->effects).inPlaceProcessing);
    return;
  }
  return;
}

Assistant:

void FAudio_INTERNAL_FreeEffectChain(FAudioVoice *voice)
{
	uint32_t i;

	LOG_FUNC_ENTER(voice->audio)
	if (voice->effects.count == 0)
	{
		LOG_FUNC_EXIT(voice->audio)
		return;
	}

	for (i = 0; i < voice->effects.count; i += 1)
	{
		voice->effects.desc[i].pEffect->UnlockForProcess(voice->effects.desc[i].pEffect);
		voice->effects.desc[i].pEffect->Release(voice->effects.desc[i].pEffect);
	}

	voice->audio->pFree(voice->effects.desc);
	voice->audio->pFree(voice->effects.parameters);
	voice->audio->pFree(voice->effects.parameterSizes);
	voice->audio->pFree(voice->effects.parameterUpdates);
	voice->audio->pFree(voice->effects.inPlaceProcessing);
	LOG_FUNC_EXIT(voice->audio)
}